

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gram.c
# Opt level: O1

Production * new_production(Grammar *g,char *name)

{
  Production **ppPVar1;
  uint uVar2;
  Production **ppPVar3;
  size_t sVar4;
  Production *pPVar5;
  anon_struct_40_4_d8687ec6_for_productions *v;
  
  sVar4 = strlen(name);
  pPVar5 = lookup_production(g,name,(uint)sVar4);
  if (pPVar5 != (Production *)0x0) {
    free(name);
    return pPVar5;
  }
  pPVar5 = (Production *)malloc(0xf0);
  memset(pPVar5,0,0xf0);
  ppPVar3 = (g->productions).v;
  ppPVar1 = (g->productions).e;
  if (ppPVar3 == (Production **)0x0) {
    (g->productions).v = ppPVar1;
    uVar2 = (g->productions).n;
    (g->productions).n = uVar2 + 1;
    (g->productions).e[uVar2] = pPVar5;
    goto LAB_0013a78f;
  }
  v = &g->productions;
  uVar2 = v->n;
  if (ppPVar3 == ppPVar1) {
    if (2 < uVar2) goto LAB_0013a784;
  }
  else if ((uVar2 & 7) == 0) {
LAB_0013a784:
    vec_add_internal(v,pPVar5);
    goto LAB_0013a78f;
  }
  v->n = uVar2 + 1;
  ppPVar3[uVar2] = pPVar5;
LAB_0013a78f:
  pPVar5->name = name;
  sVar4 = strlen(name);
  pPVar5->name_len = (uint)sVar4;
  return pPVar5;
}

Assistant:

Production *new_production(Grammar *g, char *name) {
  Production *p;
  if ((p = lookup_production(g, name, strlen(name)))) {
    FREE(name);
    return p;
  }
  p = MALLOC(sizeof(Production));
  memset(p, 0, sizeof(Production));
  vec_add(&g->productions, p);
  p->name = name;
  p->name_len = strlen(name);
  return p;
}